

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O1

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  int *piVar17;
  int iVar18;
  void *pvVar19;
  ulong uVar20;
  long lVar21;
  undefined2 *puVar22;
  ulong uVar23;
  long lVar24;
  void *pvVar25;
  long lVar26;
  int k;
  uint *puVar27;
  ulong uVar28;
  long lVar29;
  undefined4 uVar30;
  undefined2 *puVar31;
  undefined2 *puVar32;
  undefined2 *puVar33;
  ulong uVar34;
  long lVar35;
  short tmp [6] [3];
  ulong local_f8;
  Mat local_d8;
  ulong local_88;
  void *local_80;
  void *local_78;
  long local_70;
  ulong local_68;
  undefined8 local_60;
  short sStack_58;
  uint auStack_56 [9];
  
  uVar34 = (ulong)(uint)outch;
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  Mat::create(&local_d8,0x24,inch,outch,2,(Allocator *)0x0);
  if (0 < outch) {
    local_78 = kernel->data;
    local_80 = local_d8.data;
    local_70 = local_d8.cstep * local_d8.elemsize;
    local_60 = (long)local_d8.w * local_d8.elemsize;
    local_f8 = 0;
    do {
      if (0 < inch) {
        iVar18 = inch * 9 * (int)local_f8;
        uVar20 = 0;
        pvVar25 = local_80;
        do {
          lVar35 = uVar20 * 9;
          cVar1 = *(char *)((long)local_78 + lVar35 + iVar18);
          cVar2 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 1);
          cVar3 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 2);
          cVar4 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 3);
          cVar5 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 4);
          cVar6 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 5);
          cVar7 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 6);
          cVar8 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 7);
          cVar9 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 8);
          lVar35 = 4;
          do {
            sVar10 = *(short *)(&UNK_005a777c + lVar35);
            sVar11 = *(short *)(&UNK_005a777e + lVar35);
            sVar12 = *(short *)((long)&DAT_005a7780 + lVar35);
            *(short *)((long)&local_60 + lVar35 + 4) =
                 sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
            *(short *)((long)&local_60 + lVar35 + 6) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)auStack_56 + lVar35 + -2) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
            lVar35 = lVar35 + 6;
          } while (lVar35 != 0x28);
          lVar35 = 0;
          pvVar19 = pvVar25;
          do {
            sVar10 = *(short *)((long)auStack_56 + lVar35 * 6 + -2);
            uVar13 = *(uint *)((long)auStack_56 + lVar35 * 6);
            puVar27 = &DAT_005a7782;
            lVar29 = 0;
            do {
              auVar16 = vpmullw_avx(ZEXT416(*puVar27),ZEXT416(uVar13));
              uVar30 = vpextrw_avx(auVar16,1);
              *(short *)((long)pvVar19 + lVar29 * 2) =
                   (short)uVar30 + auVar16._0_2_ + *(short *)((long)puVar27 + -2) * sVar10;
              lVar29 = lVar29 + 1;
              puVar27 = (uint *)((long)puVar27 + 6);
            } while (lVar29 != 6);
            lVar35 = lVar35 + 1;
            pvVar19 = (void *)((long)pvVar19 + 0xc);
          } while (lVar35 != 6);
          uVar20 = uVar20 + 1;
          pvVar25 = (void *)((long)pvVar25 + local_60);
        } while (uVar20 != (uint)inch);
      }
      local_f8 = local_f8 + 1;
      local_80 = (void *)((long)local_80 + local_70);
      local_68 = (ulong)(uint)inch;
    } while (local_f8 != uVar34);
  }
  iVar18 = outch + 3;
  if (-1 < outch) {
    iVar18 = outch;
  }
  local_88 = uVar34;
  Mat::create(kernel_tm,inch,0x24,outch + (iVar18 >> 2) * -3,8,4,(Allocator *)0x0);
  uVar20 = 0;
  if (3 < outch) {
    iVar18 = kernel_tm->w;
    pvVar25 = kernel_tm->data;
    sVar14 = kernel_tm->elemsize;
    sVar15 = kernel_tm->cstep;
    uVar28 = 0;
    do {
      puVar32 = (undefined2 *)(local_d8.cstep * local_d8.elemsize * uVar28 + (long)local_d8.data);
      lVar35 = 0;
      do {
        if (7 < inch) {
          lVar29 = (long)pvVar25 + (long)iVar18 * sVar14 * lVar35 + (uVar28 >> 2) * sVar15 * sVar14;
          puVar31 = puVar32;
          lVar26 = 0;
          do {
            lVar24 = 0;
            puVar33 = puVar31;
            do {
              lVar21 = lVar29;
              lVar29 = 0;
              puVar22 = puVar33;
              do {
                *(undefined2 *)(lVar21 + lVar29) = *puVar22;
                puVar22 = (undefined2 *)((long)puVar22 + (long)local_d8.w * local_d8.elemsize);
                lVar29 = lVar29 + 2;
              } while (lVar29 != 0x10);
              lVar24 = lVar24 + 1;
              puVar33 = (undefined2 *)((long)puVar33 + local_d8.cstep * local_d8.elemsize);
              lVar29 = lVar21 + 0x10;
            } while (lVar24 != 4);
            lVar24 = lVar26 + 0xf;
            puVar31 = puVar31 + (long)local_d8.w * local_d8.elemsize * 4;
            lVar29 = lVar21 + 0x10;
            lVar26 = lVar26 + 8;
          } while (lVar24 < inch);
        }
        lVar35 = lVar35 + 1;
        puVar32 = puVar32 + 1;
      } while (lVar35 != 0x24);
      uVar20 = uVar28 + 4;
      uVar23 = uVar28 + 7;
      uVar28 = uVar20;
    } while (uVar23 < uVar34);
    outch = (int)local_88;
  }
  if ((int)uVar20 < outch) {
    iVar18 = kernel_tm->w;
    pvVar25 = kernel_tm->data;
    sVar14 = kernel_tm->elemsize;
    sVar15 = kernel_tm->cstep;
    uVar20 = uVar20 & 0xffffffff;
    puVar32 = (undefined2 *)(local_d8.cstep * local_d8.elemsize * uVar20 + (long)local_d8.data);
    do {
      lVar35 = 0;
      puVar31 = puVar32;
      do {
        if (7 < inch) {
          lVar26 = (long)pvVar25 +
                   (long)iVar18 * sVar14 * lVar35 +
                   (ulong)(((uint)uVar20 & 3) + ((uint)(uVar20 >> 2) & 0x3fffffff)) *
                   sVar15 * sVar14;
          lVar29 = 0;
          puVar33 = puVar31;
          do {
            lVar24 = 0;
            puVar22 = puVar33;
            do {
              *(undefined2 *)(lVar26 + lVar24) = *puVar22;
              puVar22 = (undefined2 *)((long)puVar22 + (long)local_d8.w * local_d8.elemsize);
              lVar24 = lVar24 + 2;
            } while (lVar24 != 0x10);
            lVar24 = lVar29 + 0xf;
            puVar33 = puVar33 + (long)local_d8.w * local_d8.elemsize * 4;
            lVar26 = lVar26 + 0x10;
            lVar29 = lVar29 + 8;
          } while (lVar24 < inch);
        }
        lVar35 = lVar35 + 1;
        puVar31 = puVar31 + 1;
      } while (lVar35 != 0x24);
      uVar20 = uVar20 + 1;
      puVar32 = (undefined2 *)((long)puVar32 + local_d8.cstep * local_d8.elemsize);
    } while (uVar20 != uVar34);
  }
  piVar17 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(kernel, kernel_tm, inch, outch, opt);
}